

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelInternalFormatCase::checkTextureState
          (TextureLevelInternalFormatCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  int level;
  int expected;
  GLenum GVar1;
  QueryType QVar2;
  bool bVar3;
  bool bVar4;
  qpTestResult qVar5;
  DataType DVar6;
  pointer pTVar7;
  GLfloat *pGVar8;
  GLint *pGVar9;
  int ndx;
  long lVar10;
  long lVar11;
  float fVar12;
  int initialValues [2];
  ResultCollector result;
  QueriedState state;
  MessageBuilder msg;
  ResultCollector result_1;
  long *local_3f0;
  long local_3e8;
  long local_3e0 [2];
  ResultCollector local_3d0;
  TextureLevelInternalFormatCase *local_380;
  TextureGenerationSpec *local_378;
  QueriedState local_370;
  Enum<int,_2UL> local_348;
  Enum<int,_2UL> local_338;
  undefined1 local_328 [8];
  _func_int **local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [6];
  ios_base local_2b0 [264];
  ResultCollector local_1a8;
  ios_base local_138 [264];
  
  if ((spec->levels).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (spec->levels).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pTVar7 = (spec->levels).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(spec->levels).
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7) >> 3) *
            -0x55555555) {
      bVar4 = true;
      lVar11 = 0x10;
      lVar10 = 0;
      local_380 = this;
      local_378 = spec;
      do {
        level = *(int *)((long)pTVar7 + lVar11 + -4);
        expected = *(int *)((long)&pTVar7->width + lVar11);
        GVar1 = spec->queryTarget;
        QVar2 = (local_380->super_TextureLevelCase).m_type;
        deqp::gls::StateQueryUtil::QueriedState::QueriedState(&local_370);
        local_318[0]._M_allocated_capacity._0_7_ = 0x525245202f2f20;
        local_318[0]._7_4_ = 0x203a524f;
        local_320 = (_func_int **)0xb;
        local_318[0]._M_local_buf[0xb] = '\0';
        local_328 = (undefined1  [8])local_318;
        tcu::ResultCollector::ResultCollector(&local_3d0,gl->m_log,(string *)local_328);
        if (local_328 != (undefined1  [8])local_318) {
          operator_delete((void *)local_328,
                          CONCAT17(local_318[0]._M_local_buf[7],
                                   (undefined7)local_318[0]._M_allocated_capacity) + 1);
        }
        local_328 = (undefined1  [8])gl->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"Verifying ",10);
        local_348.m_getName = glu::getTextureLevelParameterName;
        local_348.m_value = 0x1003;
        tcu::Format::Enum<int,_2UL>::toStream(&local_348,(ostream *)&local_320);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,", expecting ",0xc)
        ;
        local_338.m_getName = glu::getTextureFormatName;
        local_338.m_value = expected;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        tcu::Format::Enum<int,_2UL>::toStream(&local_338,(ostream *)&local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_320,(char *)local_3f0,local_3e8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_3f0 != local_3e0) {
          operator_delete(local_3f0,local_3e0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
        std::ios_base::~ios_base(local_2b0);
        deqp::gls::StateQueryUtil::queryTextureLevelState
                  (&local_3d0,gl,QVar2,GVar1,level,0x1003,&local_370);
        spec = local_378;
        bVar3 = deqp::gls::StateQueryUtil::QueriedState::isUndefined(&local_370);
        if (bVar3) {
          bVar3 = false;
        }
        else {
          deqp::gls::StateQueryUtil::verifyInteger(&local_3d0,&local_370,expected);
          qVar5 = tcu::ResultCollector::getResult(&local_3d0);
          bVar3 = qVar5 == QP_TEST_RESULT_PASS;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0.m_message._M_dataplus._M_p != &local_3d0.m_message.field_2) {
          operator_delete(local_3d0.m_message._M_dataplus._M_p,
                          local_3d0.m_message.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0.m_prefix._M_dataplus._M_p != &local_3d0.m_prefix.field_2) {
          operator_delete(local_3d0.m_prefix._M_dataplus._M_p,
                          local_3d0.m_prefix.field_2._M_allocated_capacity + 1);
        }
        bVar4 = (bool)(bVar4 & bVar3);
        lVar10 = lVar10 + 1;
        pTVar7 = (spec->levels).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x18;
      } while (lVar10 < (int)((ulong)((long)(spec->levels).
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pTVar7) >> 3) * -0x55555555);
      return bVar4;
    }
    return true;
  }
  local_3f0 = (long *)0x822900001908;
  GVar1 = spec->queryTarget;
  QVar2 = (this->super_TextureLevelCase).m_type;
  deqp::gls::StateQueryUtil::QueriedState::QueriedState((QueriedState *)&local_3d0);
  local_318[0]._M_allocated_capacity._0_7_ = 0x525245202f2f20;
  local_318[0]._7_4_ = 0x203a524f;
  local_320 = (_func_int **)0xb;
  local_318[0]._M_local_buf[0xb] = '\0';
  local_328 = (undefined1  [8])local_318;
  tcu::ResultCollector::ResultCollector(&local_1a8,gl->m_log,(string *)local_328);
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,
                    CONCAT17(local_318[0]._M_local_buf[7],
                             (undefined7)local_318[0]._M_allocated_capacity) + 1);
  }
  local_328 = (undefined1  [8])gl->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"Verifying ",10);
  local_370._0_8_ = glu::getTextureLevelParameterName;
  local_370.m_v.vFloat = 5.74392e-42;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_370,(ostream *)&local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,", expecting any of {",0x14);
  lVar10 = 0;
  do {
    if (lVar10 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,", ",2);
    }
    local_370.m_v.vInt = (GLint)*(GLfloat *)((long)&local_3f0 + lVar10 * 4);
    local_370._0_8_ = glu::getTextureFormatName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_370,(ostream *)&local_320);
    lVar10 = lVar10 + 1;
  } while (lVar10 == 1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"}",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  std::ios_base::~ios_base(local_2b0);
  deqp::gls::StateQueryUtil::queryTextureLevelState
            (&local_1a8,gl,QVar2,GVar1,0,0x1003,(QueriedState *)&local_3d0);
  bVar4 = deqp::gls::StateQueryUtil::QueriedState::isUndefined((QueriedState *)&local_3d0);
  if (!bVar4) {
    DVar6 = deqp::gls::StateQueryUtil::QueriedState::getType((QueriedState *)&local_3d0);
    if (DVar6 == DATATYPE_INTEGER) {
      lVar10 = 0;
      do {
        pGVar9 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)&local_3d0);
        if (*pGVar9 == *(int *)((long)&local_3f0 + lVar10 * 4)) goto LAB_0150a615;
        lVar10 = lVar10 + 1;
      } while (lVar10 == 1);
      local_328 = (undefined1  [8])gl->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"Error: got ",0xb);
      pGVar9 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)&local_3d0);
      std::ostream::operator<<((ostringstream *)&local_320,*pGVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,", (",3);
      pGVar8 = (GLfloat *)
               deqp::gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)&local_3d0);
      local_370.m_v.vInt = (GLint)*pGVar8;
      local_370._0_8_ = glu::getTextureFormatName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_370,(ostream *)&local_320);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      if (DVar6 != DATATYPE_FLOAT) goto LAB_0150a5bd;
      lVar10 = 0;
      do {
        pGVar8 = deqp::gls::StateQueryUtil::QueriedState::getFloatAccess((QueriedState *)&local_3d0)
        ;
        fVar12 = (float)*(int *)((long)&local_3f0 + lVar10 * 4);
        if ((*pGVar8 == fVar12) && (!NAN(*pGVar8) && !NAN(fVar12))) goto LAB_0150a615;
        lVar10 = lVar10 + 1;
      } while (lVar10 == 1);
      local_328 = (undefined1  [8])gl->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"Error: got ",0xb);
      pGVar8 = deqp::gls::StateQueryUtil::QueriedState::getFloatAccess((QueriedState *)&local_3d0);
      std::ostream::_M_insert<double>((double)*pGVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,", (",3);
      pGVar8 = deqp::gls::StateQueryUtil::QueriedState::getFloatAccess((QueriedState *)&local_3d0);
      local_370.m_v.vInt = (GLint)*pGVar8;
      local_370._0_8_ = glu::getTextureFormatName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_370,(ostream *)&local_320);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
    std::ios_base::~ios_base(local_2b0);
  }
LAB_0150a5bd:
  bVar4 = false;
LAB_0150a5bf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_message._M_dataplus._M_p != &local_1a8.m_message.field_2) {
    operator_delete(local_1a8.m_message._M_dataplus._M_p,
                    local_1a8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_prefix._M_dataplus._M_p != &local_1a8.m_prefix.field_2) {
    operator_delete(local_1a8.m_prefix._M_dataplus._M_p,
                    local_1a8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
LAB_0150a615:
  bVar4 = true;
  goto LAB_0150a5bf;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		bool allOk = true;

		if (spec.levels.empty())
		{
			const int queryLevel		= 0;
			const int initialValues[2]	= { GL_RGBA, GL_R8 };

			allOk &= verifyTextureLevelParameterInternalFormatAnyOf(gl, spec.queryTarget, queryLevel, GL_TEXTURE_INTERNAL_FORMAT, initialValues, DE_LENGTH_OF_ARRAY(initialValues), m_type);
		}
		else
		{
			for (int levelNdx = 0; levelNdx < (int)spec.levels.size(); ++levelNdx)
			{
				const int queryLevel	= spec.levels[levelNdx].level;
				const int refValue		= spec.levels[levelNdx].internalFormat;

				allOk &= verifyTextureLevelParameterInternalFormatEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_INTERNAL_FORMAT, refValue, m_type);
			}
		}

		return allOk;
	}